

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O0

int CfdGetTransactionFromBlock(void *handle,void *block_handle,char *txid,char **tx_hex)

{
  Block *this;
  undefined1 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  string *message;
  undefined8 *in_RCX;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Transaction tx;
  CfdCapiBlockData *block_data;
  int result;
  Transaction *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffde0;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0;
  allocator local_199;
  string local_198;
  string *in_stack_fffffffffffffe88;
  pointer in_stack_fffffffffffffe90;
  Transaction local_158;
  undefined1 local_112;
  allocator local_111;
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_20;
  long local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"BlockOpe",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  if (local_28 == (undefined8 *)0x0) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_block.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x103;
    local_88.funcname = "CfdGetTransactionFromBlock";
    cfd::core::logger::warn<>(&local_88,"tx_hex is null.");
    local_aa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. tx_hex is null.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffda0,error_code,in_stack_fffffffffffffd90);
    local_aa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar1 = cfd::capi::IsEmptyString(local_20);
  if ((bool)uVar1) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_block.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x109;
    local_c8.funcname = "CfdGetTransactionFromBlock";
    cfd::core::logger::warn<>(&local_c8,"txid is null or empty.");
    local_ea = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Failed to parameter. txid is null or empty.",&local_e9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffda0,error_code,in_stack_fffffffffffffd90);
    local_ea = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_70 + 0x18) == 0) {
    local_112 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Invalid handle state. block is null",&local_111);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffda0,error_code,in_stack_fffffffffffffd90);
    local_112 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)(local_70 + 0x10) < 3) {
    this = *(Block **)(local_70 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,local_20,&local_199);
    cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffe88,&local_198);
    cfd::core::Block::GetTransaction(&local_158,this,(Txid *)&stack0xfffffffffffffe88);
    cfd::core::Txid::~Txid((Txid *)0x5b9167);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_
              (&local_1c0,&local_158.super_AbstractTransaction);
    pcVar3 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffde0));
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1c0);
    cfd::core::Transaction::~Transaction(in_stack_fffffffffffffd80);
    return 0;
  }
  message = (string *)__cxa_allocate_exception(0x30);
  paVar4 = &local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"Elements is not supported.",paVar4);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffda0,(CfdError)((ulong)paVar4 >> 0x20),message);
  __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTransactionFromBlock(
    void* handle, void* block_handle, const char* txid, char** tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      auto tx = block_data->block->GetTransaction(Txid(std::string(txid)));
      *tx_hex = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}